

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaGetNodeContent(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlChar *name;
  xmlChar *pxVar1;
  
  name = xmlNodeGetContent(node);
  if (name == (xmlChar *)0x0) {
    name = xmlStrdup("");
  }
  pxVar1 = xmlDictLookup(ctxt->dict,name,-1);
  (*xmlFree)(name);
  if (pxVar1 == (xmlChar *)0x0) {
    xmlSchemaPErrMemory(ctxt);
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
xmlSchemaGetNodeContent(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlChar *val;
    const xmlChar *ret;

    val = xmlNodeGetContent(node);
    if (val == NULL)
	val = xmlStrdup((xmlChar *)"");
    ret = xmlDictLookup(ctxt->dict, val, -1);
    xmlFree(val);
    if (ret == NULL)
        xmlSchemaPErrMemory(ctxt);
    return(ret);
}